

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax.cpp
# Opt level: O0

void LiteScript::Syntax::PopOperator
               (vector<LiteScript::Syntax::Operators,_std::allocator<LiteScript::Syntax::Operators>_>
                *op,vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>
                    *instrl)

{
  vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_> *this;
  reference pvVar1;
  reference pvVar2;
  Instruction local_248;
  Instruction local_238;
  Instruction local_228;
  Instruction local_218;
  Instruction local_208;
  Instruction local_1f8;
  Instruction local_1e8;
  Instruction local_1d8;
  Instruction local_1c8;
  Instruction local_1b8;
  Instruction local_1a8;
  Instruction local_198;
  Instruction local_188;
  Instruction local_178;
  Instruction local_168;
  Instruction local_158;
  Instruction local_148;
  Instruction local_138;
  Instruction local_128;
  Instruction local_118;
  Instruction local_108;
  Instruction local_f8;
  Instruction local_e8;
  Instruction local_d8;
  Instruction local_c8;
  Instruction local_b8;
  Instruction local_a8;
  Instruction local_98;
  Instruction local_88;
  Instruction local_78;
  Instruction local_68;
  Instruction local_58;
  Instruction local_48 [2];
  Instruction local_28;
  vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_> *local_18;
  vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_> *instrl_local;
  vector<LiteScript::Syntax::Operators,_std::allocator<LiteScript::Syntax::Operators>_> *op_local;
  
  local_18 = instrl;
  instrl_local = (vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_> *)op;
  pvVar1 = std::
           vector<LiteScript::Syntax::Operators,_std::allocator<LiteScript::Syntax::Operators>_>::
           back(op);
  this = local_18;
  switch(*pvVar1) {
  case OP_POST_INCR:
    Instruction::Instruction(&local_28,INSTR_OP_POST_INCR);
    std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::push_back
              (this,&local_28);
    Instruction::~Instruction(&local_28);
    break;
  case OP_POST_DECR:
    Instruction::Instruction(local_48,INSTR_OP_POST_DECR);
    std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::push_back
              (this,local_48);
    Instruction::~Instruction(local_48);
    break;
  case OP_CALL:
    Instruction::Instruction(&local_58,INSTR_OP_CALL);
    std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::push_back
              (this,&local_58);
    Instruction::~Instruction(&local_58);
    break;
  case OP_GET:
    Instruction::Instruction(&local_68,INSTR_OP_ARRAY);
    std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::push_back
              (this,&local_68);
    Instruction::~Instruction(&local_68);
    break;
  case OP_MEMBER:
    pvVar2 = std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::back
                       (local_18);
    pvVar2->code = '9';
    break;
  case OP_PRE_INCR:
    Instruction::Instruction(&local_78,INSTR_OP_PRE_INCR);
    std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::push_back
              (this,&local_78);
    Instruction::~Instruction(&local_78);
    break;
  case OP_PRE_DECR:
    Instruction::Instruction(&local_88,INSTR_OP_PRE_DECR);
    std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::push_back
              (this,&local_88);
    Instruction::~Instruction(&local_88);
    break;
  case OP_UNARY_PLUS:
    Instruction::Instruction(&local_98,INSTR_OP_UNARY_PLUS);
    std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::push_back
              (this,&local_98);
    Instruction::~Instruction(&local_98);
    break;
  case OP_UNARY_MINUS:
    Instruction::Instruction(&local_a8,INSTR_OP_UNARY_MINUS);
    std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::push_back
              (this,&local_a8);
    Instruction::~Instruction(&local_a8);
    break;
  case OP_NOT:
    Instruction::Instruction(&local_b8,INSTR_OP_LOG_NOT);
    std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::push_back
              (this,&local_b8);
    Instruction::~Instruction(&local_b8);
    break;
  case OP_BIT_NOT:
    Instruction::Instruction(&local_c8,INSTR_OP_BIT_NOT);
    std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::push_back
              (this,&local_c8);
    Instruction::~Instruction(&local_c8);
    break;
  case OP_NEW:
    Instruction::Instruction(&local_d8,INSTR_VALUE_OBJECT);
    std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::push_back
              (this,&local_d8);
    Instruction::~Instruction(&local_d8);
    break;
  case OP_MUL:
    Instruction::Instruction(&local_e8,INSTR_OP_MUL);
    std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::push_back
              (this,&local_e8);
    Instruction::~Instruction(&local_e8);
    break;
  case OP_DIV:
    Instruction::Instruction(&local_f8,INSTR_OP_DIV);
    std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::push_back
              (this,&local_f8);
    Instruction::~Instruction(&local_f8);
    break;
  case OP_MOD:
    Instruction::Instruction(&local_108,INSTR_OP_MOD);
    std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::push_back
              (this,&local_108);
    Instruction::~Instruction(&local_108);
    break;
  case OP_ADD:
    Instruction::Instruction(&local_118,INSTR_OP_ADD);
    std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::push_back
              (this,&local_118);
    Instruction::~Instruction(&local_118);
    break;
  case OP_SUB:
    Instruction::Instruction(&local_128,INSTR_OP_SUB);
    std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::push_back
              (this,&local_128);
    Instruction::~Instruction(&local_128);
    break;
  case OP_LSHIFT:
    Instruction::Instruction(&local_138,INSTR_OP_LSHIFT);
    std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::push_back
              (this,&local_138);
    Instruction::~Instruction(&local_138);
    break;
  case OP_RSHIFT:
    Instruction::Instruction(&local_148,INSTR_OP_RSHIFT);
    std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::push_back
              (this,&local_148);
    Instruction::~Instruction(&local_148);
    break;
  case OP_LESS:
    Instruction::Instruction(&local_158,INSTR_OP_LESS);
    std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::push_back
              (this,&local_158);
    Instruction::~Instruction(&local_158);
    break;
  case OP_LESS_EQU:
    Instruction::Instruction(&local_168,INSTR_OP_LESS_EQU);
    std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::push_back
              (this,&local_168);
    Instruction::~Instruction(&local_168);
    break;
  case OP_GREAT:
    Instruction::Instruction(&local_178,INSTR_OP_GREAT);
    std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::push_back
              (this,&local_178);
    Instruction::~Instruction(&local_178);
    break;
  case OP_GREAT_EQU:
    Instruction::Instruction(&local_188,INSTR_OP_GREAT_EQU);
    std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::push_back
              (this,&local_188);
    Instruction::~Instruction(&local_188);
    break;
  case OP_EQU:
    Instruction::Instruction(&local_198,INSTR_OP_EQU);
    std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::push_back
              (this,&local_198);
    Instruction::~Instruction(&local_198);
    break;
  case OP_DIF:
    Instruction::Instruction(&local_1a8,INSTR_OP_DIF);
    std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::push_back
              (this,&local_1a8);
    Instruction::~Instruction(&local_1a8);
    break;
  case OP_BIT_AND:
    Instruction::Instruction(&local_1b8,INSTR_OP_BIT_AND);
    std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::push_back
              (this,&local_1b8);
    Instruction::~Instruction(&local_1b8);
    break;
  case OP_BIT_XOR:
    Instruction::Instruction(&local_1c8,INSTR_OP_BIT_XOR);
    std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::push_back
              (this,&local_1c8);
    Instruction::~Instruction(&local_1c8);
    break;
  case OP_BIT_OR:
    Instruction::Instruction(&local_1d8,INSTR_OP_BIT_OR);
    std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::push_back
              (this,&local_1d8);
    Instruction::~Instruction(&local_1d8);
    break;
  case OP_AND:
    Instruction::Instruction(&local_1e8,INSTR_OP_LOG_AND);
    std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::push_back
              (this,&local_1e8);
    Instruction::~Instruction(&local_1e8);
    break;
  case OP_OR:
    Instruction::Instruction(&local_1f8,INSTR_OP_LOG_OR);
    std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::push_back
              (this,&local_1f8);
    Instruction::~Instruction(&local_1f8);
    break;
  case OP_ASSIGN:
    Instruction::Instruction(&local_208,INSTR_OP_ASSIGN);
    std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::push_back
              (this,&local_208);
    Instruction::~Instruction(&local_208);
    break;
  case OP_ADD_ASSIGN:
    Instruction::Instruction(&local_218,INSTR_OP_ADD_ASSIGN);
    std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::push_back
              (this,&local_218);
    Instruction::~Instruction(&local_218);
    break;
  case OP_SUB_ASSIGN:
    Instruction::Instruction(&local_228,INSTR_OP_SUB_ASSIGN);
    std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::push_back
              (this,&local_228);
    Instruction::~Instruction(&local_228);
    break;
  case OP_MUL_ASSIGN:
    Instruction::Instruction(&local_238,INSTR_OP_MUL_ASSIGN);
    std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::push_back
              (this,&local_238);
    Instruction::~Instruction(&local_238);
    break;
  case OP_DIV_ASSIGN:
    Instruction::Instruction(&local_248,INSTR_OP_DIV_ASSIGN);
    std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::push_back
              (this,&local_248);
    Instruction::~Instruction(&local_248);
  }
  std::vector<LiteScript::Syntax::Operators,_std::allocator<LiteScript::Syntax::Operators>_>::
  pop_back((vector<LiteScript::Syntax::Operators,_std::allocator<LiteScript::Syntax::Operators>_> *)
           instrl_local);
  return;
}

Assistant:

void LiteScript::Syntax::PopOperator(std::vector<Operators> &op, std::vector<Instruction>& instrl) {
    switch (op.back()) {
        // LEVEL 1
        case Operators::OP_POST_INCR:
            instrl.push_back(Instruction(InstrCode::INSTR_OP_POST_INCR));
            break;
        case Operators::OP_POST_DECR:
            instrl.push_back(Instruction(InstrCode::INSTR_OP_POST_DECR));
            break;
        case Operators::OP_CALL:
            instrl.push_back(Instruction(InstrCode::INSTR_OP_CALL));
            break;
        case Operators::OP_GET:
            instrl.push_back(Instruction(InstrCode::INSTR_OP_ARRAY));
            break;
        case Operators::OP_MEMBER:
            instrl.back().code = InstrCode::INSTR_OP_MEMBER;
            break;
        // LEVEL 2
        case Operators::OP_PRE_INCR:
            instrl.push_back(Instruction(InstrCode::INSTR_OP_PRE_INCR));
            break;
        case Operators::OP_PRE_DECR:
            instrl.push_back(Instruction(InstrCode::INSTR_OP_PRE_DECR));
            break;
        case Operators::OP_UNARY_PLUS:
            instrl.push_back(Instruction(InstrCode::INSTR_OP_UNARY_PLUS));
            break;
        case Operators::OP_UNARY_MINUS:
            instrl.push_back(Instruction(InstrCode::INSTR_OP_UNARY_MINUS));
            break;
        case Operators::OP_NOT:
            instrl.push_back(Instruction(InstrCode::INSTR_OP_LOG_NOT));
            break;
        case Operators::OP_BIT_NOT:
            instrl.push_back(Instruction(InstrCode::INSTR_OP_BIT_NOT));
            break;
        case Operators::OP_NEW:
            instrl.push_back(Instruction(InstrCode::INSTR_VALUE_OBJECT));
            break;
        // LEVEL 3
        case Operators::OP_MUL:
            instrl.push_back(Instruction(InstrCode::INSTR_OP_MUL));
            break;
        case Operators::OP_DIV:
            instrl.push_back(Instruction(InstrCode::INSTR_OP_DIV));
            break;
        case Operators::OP_MOD:
            instrl.push_back(Instruction(InstrCode::INSTR_OP_MOD));
            break;
        // LEVEL 4
        case Operators::OP_ADD:
            instrl.push_back(Instruction(InstrCode::INSTR_OP_ADD));
            break;
        case Operators::OP_SUB:
            instrl.push_back(Instruction(InstrCode::INSTR_OP_SUB));
            break;
        // LEVEL 5
        case Operators::OP_LSHIFT:
            instrl.push_back(Instruction(InstrCode::INSTR_OP_LSHIFT));
            break;
        case Operators::OP_RSHIFT:
            instrl.push_back(Instruction(InstrCode::INSTR_OP_RSHIFT));
            break;
        // LEVEL 6
        case Operators::OP_LESS:
            instrl.push_back(Instruction(InstrCode::INSTR_OP_LESS));
            break;
        case Operators::OP_LESS_EQU:
            instrl.push_back(Instruction(InstrCode::INSTR_OP_LESS_EQU));
            break;
        case Operators::OP_GREAT:
            instrl.push_back(Instruction(InstrCode::INSTR_OP_GREAT));
            break;
        case Operators::OP_GREAT_EQU:
            instrl.push_back(Instruction(InstrCode::INSTR_OP_GREAT_EQU));
            break;
        // LEVEL 7
        case Operators::OP_EQU:
            instrl.push_back(Instruction(InstrCode::INSTR_OP_EQU));
            break;
        case Operators::OP_DIF:
            instrl.push_back(Instruction(InstrCode::INSTR_OP_DIF));
            break;
        // LEVEL 8
        case Operators::OP_BIT_AND:
            instrl.push_back(Instruction(InstrCode::INSTR_OP_BIT_AND));
            break;
        // LEVEL 9
        case Operators::OP_BIT_XOR:
            instrl.push_back(Instruction(InstrCode::INSTR_OP_BIT_XOR));
            break;
        // LEVEL 10
        case Operators::OP_BIT_OR:
            instrl.push_back(Instruction(InstrCode::INSTR_OP_BIT_OR));
            break;
        // LEVEL 11
        case Operators::OP_AND:
            instrl.push_back(Instruction(InstrCode::INSTR_OP_LOG_AND));
            break;
        // LEVEL 12
        case Operators::OP_OR:
            instrl.push_back(Instruction(InstrCode::INSTR_OP_LOG_OR));
            break;
        // LEVEL 13
        case Operators::OP_ASSIGN:
            instrl.push_back(Instruction(InstrCode::INSTR_OP_ASSIGN));
            break;
        case Operators::OP_ADD_ASSIGN:
            instrl.push_back(Instruction(InstrCode::INSTR_OP_ADD_ASSIGN));
            break;
        case Operators::OP_SUB_ASSIGN:
            instrl.push_back(Instruction(InstrCode::INSTR_OP_SUB_ASSIGN));
            break;
        case Operators::OP_MUL_ASSIGN:
            instrl.push_back(Instruction(InstrCode::INSTR_OP_MUL_ASSIGN));
            break;
        case Operators::OP_DIV_ASSIGN:
            instrl.push_back(Instruction(InstrCode::INSTR_OP_DIV_ASSIGN));
            break;
        default:
            break;
    }
    op.pop_back();
}